

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O2

Matrix44<double> * __thiscall
Imath_2_5::Euler<double>::toMatrix44(Matrix44<double> *__return_storage_ptr__,Euler<double> *this)

{
  undefined8 uVar1;
  byte bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar11;
  double dVar12;
  int k;
  int j;
  int i;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  double local_30;
  undefined1 local_28 [16];
  
  angleOrder(this,&local_6c,&local_70,&local_74);
  bVar2 = this->field_0x18;
  local_48 = *(double *)((long)&(this->super_Vec3<double>).x + (ulong)((bVar2 & 1) << 4));
  local_68._0_8_ = (this->super_Vec3<double>).y;
  uVar1 = *(undefined8 *)((long)&(this->super_Vec3<double>).x + (ulong)(((byte)~bVar2 & 1) << 4));
  uVar9 = (undefined4)uVar1;
  uVar10 = (uint)((ulong)uVar1 >> 0x20);
  uStack_4c = 0x80000000;
  if ((bVar2 & 4) == 0) {
    uVar10 = uVar10 ^ 0x80000000;
    local_68._0_8_ = local_68._0_8_ ^ 0x8000000000000000;
    local_68._8_4_ = 0;
    local_68._12_4_ = 0x80000000;
    local_48 = -local_48;
    uStack_40 = 0x8000000000000000;
  }
  else {
    uStack_40 = 0;
    local_68._8_8_ = 0;
    uStack_4c = 0;
  }
  local_58 = (double)CONCAT44(uVar10,uVar9);
  uStack_50 = 0;
  local_30 = cos((double)CONCAT44(uVar10,uVar9));
  dVar3 = cos((double)local_68._0_8_);
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._0_8_ = dVar3;
  local_28._12_4_ = extraout_XMM0_Dd;
  local_38 = cos(local_48);
  local_58 = sin(local_58);
  dVar3 = sin((double)local_68._0_8_);
  local_68._8_4_ = extraout_XMM0_Dc_00;
  local_68._0_8_ = dVar3;
  local_68._12_4_ = extraout_XMM0_Dd_00;
  dVar3 = sin(local_48);
  dVar4 = local_30 * local_38;
  dVar11 = local_30 * dVar3;
  dVar5 = local_38 * local_58;
  dVar12 = local_58 * dVar3;
  __return_storage_ptr__->x[1][1] = 0.0;
  __return_storage_ptr__->x[1][2] = 0.0;
  __return_storage_ptr__->x[2][1] = 0.0;
  __return_storage_ptr__->x[2][2] = 0.0;
  __return_storage_ptr__->x[0][1] = 0.0;
  __return_storage_ptr__->x[0][2] = 0.0;
  __return_storage_ptr__->x[0][3] = 0.0;
  __return_storage_ptr__->x[1][0] = 0.0;
  __return_storage_ptr__->x[1][3] = 0.0;
  __return_storage_ptr__->x[2][0] = 0.0;
  __return_storage_ptr__->x[2][3] = 0.0;
  __return_storage_ptr__->x[3][0] = 0.0;
  __return_storage_ptr__->x[3][1] = 0.0;
  __return_storage_ptr__->x[3][2] = 0.0;
  __return_storage_ptr__->x[0][0] = 1.0;
  __return_storage_ptr__->x[1][1] = 1.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  if ((this->field_0x18 & 2) == 0) {
    lVar6 = (long)local_6c;
    *(double *)((long)__return_storage_ptr__->x + lVar6 * 0x28) = local_38 * (double)local_28._0_8_;
    lVar7 = (long)local_70;
    __return_storage_ptr__->x[lVar7][lVar6] = (double)local_68._0_8_ * dVar5 - dVar11;
    lVar8 = (long)local_74;
    __return_storage_ptr__->x[lVar8][lVar6] = (double)local_68._0_8_ * dVar4 + dVar12;
    __return_storage_ptr__->x[lVar6][lVar7] = dVar3 * (double)local_28._0_8_;
    *(double *)((long)__return_storage_ptr__->x + lVar7 * 0x28) =
         dVar12 * (double)local_68._0_8_ + dVar4;
    __return_storage_ptr__->x[lVar8][lVar7] = (double)local_68._0_8_ * dVar11 - dVar5;
    __return_storage_ptr__->x[lVar6][lVar8] = -(double)local_68._0_8_;
    __return_storage_ptr__->x[lVar7][lVar8] = local_58 * (double)local_28._0_8_;
    *(double *)((long)__return_storage_ptr__->x + lVar8 * 0x28) = local_30 * (double)local_28._0_8_;
  }
  else {
    lVar7 = (long)local_6c;
    *(undefined8 *)((long)__return_storage_ptr__->x + lVar7 * 0x28) = local_28._0_8_;
    lVar8 = (long)local_70;
    __return_storage_ptr__->x[lVar8][lVar7] = local_58 * (double)local_68._0_8_;
    lVar6 = (long)local_74;
    __return_storage_ptr__->x[lVar6][lVar7] = local_30 * (double)local_68._0_8_;
    __return_storage_ptr__->x[lVar7][lVar8] = dVar3 * (double)local_68._0_8_;
    *(double *)((long)__return_storage_ptr__->x + lVar8 * 0x28) =
         dVar4 - (double)local_28._0_8_ * dVar12;
    __return_storage_ptr__->x[lVar6][lVar8] = -(double)local_28._0_8_ * dVar11 - dVar5;
    __return_storage_ptr__->x[lVar7][lVar6] = local_38 * -(double)local_68._0_8_;
    __return_storage_ptr__->x[lVar8][lVar6] = dVar5 * (double)local_28._0_8_ + dVar11;
    *(double *)((long)__return_storage_ptr__->x + lVar6 * 0x28) =
         (double)local_28._0_8_ * dVar4 - dVar12;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix44<T> Euler<T>::toMatrix44() const
{
    int i,j,k;
    angleOrder(i,j,k);

    Vec3<T> angles;

    if ( _frameStatic ) angles = (*this);
    else angles = Vec3<T>(z,y,x);

    if ( !_parityEven ) angles *= -1.0;

    T ci = Math<T>::cos(angles.x);
    T cj = Math<T>::cos(angles.y);
    T ch = Math<T>::cos(angles.z);
    T si = Math<T>::sin(angles.x);
    T sj = Math<T>::sin(angles.y);
    T sh = Math<T>::sin(angles.z);

    T cc = ci*ch;
    T cs = ci*sh;
    T sc = si*ch;
    T ss = si*sh;

    Matrix44<T> M;

    if ( _initialRepeated )
    {
	M[i][i] = cj;	  M[j][i] =  sj*si;    M[k][i] =  sj*ci;
	M[i][j] = sj*sh;  M[j][j] = -cj*ss+cc; M[k][j] = -cj*cs-sc;
	M[i][k] = -sj*ch; M[j][k] =  cj*sc+cs; M[k][k] =  cj*cc-ss;
    }
    else
    {
	M[i][i] = cj*ch; M[j][i] = sj*sc-cs; M[k][i] = sj*cc+ss;
	M[i][j] = cj*sh; M[j][j] = sj*ss+cc; M[k][j] = sj*cs-sc;
	M[i][k] = -sj;	 M[j][k] = cj*si;    M[k][k] = cj*ci;
    }

    return M;
}